

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

int utf8_line_count(utf8_char_t *data)

{
  int iVar1;
  size_t sVar2;
  utf8_char_t *in_RDI;
  int count;
  size_t len;
  int local_14;
  
  local_14 = 0;
  iVar1 = local_14;
  do {
    local_14 = iVar1;
    sVar2 = utf8_line_length(in_RDI);
    in_RDI = in_RDI + sVar2;
    iVar1 = local_14 + 1;
  } while (sVar2 != 0);
  return local_14;
}

Assistant:

int utf8_line_count(const utf8_char_t* data)
{
    size_t len = 0;
    int count = 0;

    do {
        len = utf8_line_length(data);
        data += len;
        ++count;
    } while (0 < len);

    return count - 1;
}